

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  U32 UVar2;
  uint uVar3;
  U32 UVar4;
  U32 UVar5;
  U32 *pUVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  ZSTD_matchState_t *pZVar9;
  U32 *pUVar10;
  U32 *pUVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  U32 UVar19;
  U32 UVar20;
  uint uVar21;
  U32 UVar22;
  U32 UVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  BYTE *pBVar26;
  BYTE *pBVar27;
  size_t sVar28;
  size_t sVar29;
  size_t sVar30;
  size_t sVar31;
  U64 UVar32;
  U64 UVar33;
  bool bVar34;
  U32 local_d04;
  U32 local_d00;
  BYTE *local_cb8;
  BYTE *local_ca8;
  BYTE *local_c20;
  BYTE *local_c10;
  U32 local_bbc;
  U32 local_bb8;
  BYTE *local_b70;
  BYTE *local_b60;
  BYTE *local_ad8;
  BYTE *local_ac8;
  U32 local_a74;
  U32 local_a70;
  BYTE *local_a28;
  BYTE *local_a18;
  BYTE *local_990;
  BYTE *local_980;
  U32 local_92c;
  U32 local_928;
  BYTE *local_8e0;
  BYTE *local_8d0;
  BYTE *local_848;
  BYTE *local_838;
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff_3;
  size_t rLength_3;
  U32 tmpOffset_3;
  size_t repLength2_3;
  BYTE *repEnd2_3;
  BYTE *repMatch2_3;
  U32 repIndex2_3;
  U32 current2_3;
  BYTE *dictMatchL3_3;
  BYTE *pBStack_760;
  U32 dictMatchIndexL3_3;
  BYTE *matchL3_3;
  U32 matchIndexL3_3;
  size_t dictHLNext_3;
  size_t hl3_3;
  BYTE *pBStack_738;
  U32 dictMatchIndexS_3;
  BYTE *dictMatchL_3;
  U32 dictMatchIndexL_3;
  BYTE *repMatchEnd_3;
  BYTE *repMatch_3;
  BYTE *pBStack_710;
  U32 repIndex_3;
  BYTE *match_3;
  BYTE *matchLong_3;
  U32 matchIndexS_3;
  U32 matchIndexL_3;
  U32 current_3;
  size_t dictHS_3;
  size_t dictHL_3;
  size_t h_3;
  size_t h2_3;
  long lStack_6c8;
  U32 offset_5;
  size_t mLength_3;
  U32 maxRep_3;
  U32 dictAndPrefixLength_3;
  U32 dictHBitsS_3;
  U32 dictHBitsL_3;
  U32 dictIndexDelta_3;
  BYTE *dictEnd_3;
  BYTE *dictStart_3;
  BYTE *dictBase_3;
  U32 dictStartIndex_3;
  U32 *dictHashSmall_3;
  U32 *dictHashLong_3;
  ZSTD_compressionParameters *dictCParams_3;
  ZSTD_matchState_t *dms_3;
  U32 local_660;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixLowest_3;
  BYTE *pBStack_638;
  U32 prefixLowestIndex_3;
  BYTE *anchor_3;
  BYTE *ip_3;
  BYTE *istart_3;
  BYTE *base_3;
  U32 hBitsS_3;
  U32 *hashSmall_3;
  U32 hBitsL_3;
  U32 *hashLong_3;
  ZSTD_compressionParameters *cParams_3;
  U32 tmpOff_2;
  size_t rLength_2;
  U32 tmpOffset_2;
  size_t repLength2_2;
  BYTE *repEnd2_2;
  BYTE *repMatch2_2;
  U32 repIndex2_2;
  U32 current2_2;
  BYTE *dictMatchL3_2;
  BYTE *pBStack_578;
  U32 dictMatchIndexL3_2;
  BYTE *matchL3_2;
  U32 matchIndexL3_2;
  size_t dictHLNext_2;
  size_t hl3_2;
  BYTE *pBStack_550;
  U32 dictMatchIndexS_2;
  BYTE *dictMatchL_2;
  U32 dictMatchIndexL_2;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  BYTE *pBStack_528;
  U32 repIndex_2;
  BYTE *match_2;
  BYTE *matchLong_2;
  U32 matchIndexS_2;
  U32 matchIndexL_2;
  U32 current_2;
  size_t dictHS_2;
  size_t dictHL_2;
  size_t h_2;
  size_t h2_2;
  long lStack_4e0;
  U32 offset_4;
  size_t mLength_2;
  U32 maxRep_2;
  U32 dictAndPrefixLength_2;
  U32 dictHBitsS_2;
  U32 dictHBitsL_2;
  U32 dictIndexDelta_2;
  BYTE *dictEnd_2;
  BYTE *dictStart_2;
  BYTE *dictBase_2;
  U32 dictStartIndex_2;
  U32 *dictHashSmall_2;
  U32 *dictHashLong_2;
  ZSTD_compressionParameters *dictCParams_2;
  ZSTD_matchState_t *dms_2;
  U32 local_478;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixLowest_2;
  BYTE *pBStack_450;
  U32 prefixLowestIndex_2;
  BYTE *anchor_2;
  BYTE *ip_2;
  BYTE *istart_2;
  BYTE *base_2;
  U32 hBitsS_2;
  U32 *hashSmall_2;
  U32 hBitsL_2;
  U32 *hashLong_2;
  ZSTD_compressionParameters *cParams_2;
  U32 tmpOff_1;
  size_t rLength_1;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  BYTE *dictMatchL3_1;
  BYTE *pBStack_390;
  U32 dictMatchIndexL3_1;
  BYTE *matchL3_1;
  U32 matchIndexL3_1;
  size_t dictHLNext_1;
  size_t hl3_1;
  BYTE *pBStack_368;
  U32 dictMatchIndexS_1;
  BYTE *dictMatchL_1;
  U32 dictMatchIndexL_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  BYTE *pBStack_340;
  U32 repIndex_1;
  BYTE *match_1;
  BYTE *matchLong_1;
  U32 matchIndexS_1;
  U32 matchIndexL_1;
  U32 current_1;
  size_t dictHS_1;
  size_t dictHL_1;
  size_t h_1;
  size_t h2_1;
  long lStack_2f8;
  U32 offset_3;
  size_t mLength_1;
  U32 maxRep_1;
  U32 dictAndPrefixLength_1;
  U32 dictHBitsS_1;
  U32 dictHBitsL_1;
  U32 dictIndexDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashSmall_1;
  U32 *dictHashLong_1;
  ZSTD_compressionParameters *dictCParams_1;
  ZSTD_matchState_t *dms_1;
  U32 local_290;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixLowest_1;
  BYTE *pBStack_268;
  U32 prefixLowestIndex_1;
  BYTE *anchor_1;
  BYTE *ip_1;
  BYTE *istart_1;
  BYTE *base_1;
  U32 hBitsS_1;
  U32 *hashSmall_1;
  U32 hBitsL_1;
  U32 *hashLong_1;
  ZSTD_compressionParameters *cParams_1;
  U32 tmpOff;
  size_t rLength;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  BYTE *dictMatchL3;
  BYTE *pBStack_1a8;
  U32 dictMatchIndexL3;
  BYTE *matchL3;
  U32 matchIndexL3;
  size_t dictHLNext;
  size_t hl3;
  BYTE *pBStack_180;
  U32 dictMatchIndexS;
  BYTE *dictMatchL;
  U32 dictMatchIndexL;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_158;
  U32 repIndex;
  BYTE *match;
  BYTE *matchLong;
  U32 matchIndexS;
  U32 matchIndexL;
  U32 current;
  size_t dictHS;
  size_t dictHL;
  size_t h;
  size_t h2;
  long lStack_110;
  U32 offset;
  size_t mLength;
  U32 maxRep;
  U32 dictAndPrefixLength;
  U32 dictHBitsS;
  U32 dictHBitsL;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashSmall;
  U32 *dictHashLong;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  U32 local_a8;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixLowest;
  BYTE *pBStack_80;
  U32 prefixLowestIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  
  iVar14 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar7 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar8 = (ms->window).base;
    uVar3 = (ms->window).dictLimit;
    pBVar24 = pBVar8 + uVar3;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved = *rep;
    local_a8 = rep[1];
    pZVar9 = ms->dictMatchState;
    pUVar10 = pZVar9->hashTable;
    pUVar11 = pZVar9->chainTable;
    pBVar12 = (pZVar9->window).base;
    pBVar27 = pBVar12 + (pZVar9->window).dictLimit;
    pBVar13 = (pZVar9->window).nextSrc;
    uVar16 = uVar3 - ((int)pBVar13 - (int)pBVar12);
    UVar4 = (pZVar9->cParams).hashLog;
    UVar5 = (pZVar9->cParams).chainLog;
    anchor = (BYTE *)((long)src +
                     (long)(int)(uint)((iVar14 - (int)pBVar24) + (int)pBVar13 == (int)pBVar27));
    pBStack_80 = (BYTE *)src;
LAB_006a8a0f:
    if (anchor < pBVar26) {
      sVar28 = ZSTD_hashPtr(anchor,UVar1,8);
      sVar29 = ZSTD_hashPtr(anchor,UVar2,4);
      sVar30 = ZSTD_hashPtr(anchor,UVar4,8);
      sVar31 = ZSTD_hashPtr(anchor,UVar5,4);
      iVar15 = (int)pBVar8;
      iVar14 = (int)anchor;
      uVar17 = iVar14 - iVar15;
      uVar21 = pUVar6[sVar28];
      matchLong._4_4_ = pUVar7[sVar29];
      match = pBVar8 + uVar21;
      pBStack_158 = pBVar8 + matchLong._4_4_;
      uVar18 = (uVar17 + 1) - offsetSaved;
      if (uVar18 < uVar3) {
        local_838 = pBVar12 + (uVar18 - uVar16);
      }
      else {
        local_838 = pBVar8 + uVar18;
      }
      pUVar7[sVar29] = uVar17;
      pUVar6[sVar28] = uVar17;
      if ((uVar3 - 1) - uVar18 < 3) {
LAB_006a8d49:
        if (uVar3 < uVar21) {
          UVar32 = MEM_read64(match);
          UVar33 = MEM_read64(anchor);
          if (UVar32 != UVar33) goto LAB_006a8fcb;
          sVar28 = ZSTD_count(anchor + 8,match + 8,pBVar25);
          lStack_110 = sVar28 + 8;
          h2._4_4_ = iVar14 - (int)match;
          while( true ) {
            bVar34 = false;
            if (pBStack_80 < anchor && pBVar24 < match) {
              bVar34 = anchor[-1] == match[-1];
            }
            if (!bVar34) break;
            anchor = anchor + -1;
            match = match + -1;
            lStack_110 = lStack_110 + 1;
          }
          goto LAB_006a959f;
        }
        uVar21 = pUVar10[sVar30];
        pBStack_180 = pBVar12 + uVar21;
        if (pBVar27 < pBStack_180) {
          UVar32 = MEM_read64(pBStack_180);
          UVar33 = MEM_read64(anchor);
          if (UVar32 == UVar33) {
            sVar28 = ZSTD_count_2segments(anchor + 8,pBStack_180 + 8,pBVar25,pBVar13,pBVar24);
            lStack_110 = sVar28 + 8;
            h2._4_4_ = (uVar17 - uVar21) - uVar16;
            while( true ) {
              bVar34 = false;
              if (pBStack_80 < anchor && pBVar27 < pBStack_180) {
                bVar34 = anchor[-1] == pBStack_180[-1];
              }
              if (!bVar34) break;
              anchor = anchor + -1;
              pBStack_180 = pBStack_180 + -1;
              lStack_110 = lStack_110 + 1;
            }
            goto LAB_006a959f;
          }
        }
LAB_006a8fcb:
        if (uVar3 < matchLong._4_4_) {
          UVar19 = MEM_read32(pBStack_158);
          UVar20 = MEM_read32(anchor);
          if (UVar19 == UVar20) {
LAB_006a90aa:
            sVar28 = ZSTD_hashPtr(anchor + 1,UVar1,8);
            sVar29 = ZSTD_hashPtr(anchor + 1,UVar4,8);
            uVar21 = pUVar6[sVar28];
            pBStack_1a8 = pBVar8 + uVar21;
            pUVar6[sVar28] = uVar17 + 1;
            if (uVar3 < uVar21) {
              UVar32 = MEM_read64(pBStack_1a8);
              UVar33 = MEM_read64(anchor + 1);
              if (UVar32 != UVar33) goto code_r0x006a93d7;
              sVar28 = ZSTD_count(anchor + 9,pBStack_1a8 + 8,pBVar25);
              lStack_110 = sVar28 + 8;
              anchor = anchor + 1;
              h2._4_4_ = (int)anchor - (int)pBStack_1a8;
              while( true ) {
                bVar34 = false;
                if (pBStack_80 < anchor && pBVar24 < pBStack_1a8) {
                  bVar34 = anchor[-1] == pBStack_1a8[-1];
                }
                if (!bVar34) break;
                anchor = anchor + -1;
                pBStack_1a8 = pBStack_1a8 + -1;
                lStack_110 = lStack_110 + 1;
              }
            }
            else {
              uVar21 = pUVar10[sVar29];
              _repIndex2 = pBVar12 + uVar21;
              if (pBVar27 < _repIndex2) {
                UVar32 = MEM_read64(_repIndex2);
                UVar33 = MEM_read64(anchor + 1);
                if (UVar32 == UVar33) {
                  sVar28 = ZSTD_count_2segments(anchor + 9,_repIndex2 + 8,pBVar25,pBVar13,pBVar24);
                  lStack_110 = sVar28 + 8;
                  anchor = anchor + 1;
                  h2._4_4_ = ((uVar17 + 1) - uVar21) - uVar16;
                  while( true ) {
                    bVar34 = false;
                    if (pBStack_80 < anchor && pBVar27 < _repIndex2) {
                      bVar34 = anchor[-1] == _repIndex2[-1];
                    }
                    if (!bVar34) break;
                    anchor = anchor + -1;
                    _repIndex2 = _repIndex2 + -1;
                    lStack_110 = lStack_110 + 1;
                  }
                  goto LAB_006a959f;
                }
              }
code_r0x006a93d7:
              if (matchLong._4_4_ < uVar3) {
                sVar28 = ZSTD_count_2segments(anchor + 4,pBStack_158 + 4,pBVar25,pBVar13,pBVar24);
                lStack_110 = sVar28 + 4;
                h2._4_4_ = uVar17 - matchLong._4_4_;
                while( true ) {
                  bVar34 = false;
                  if (pBStack_80 < anchor && pBVar27 < pBStack_158) {
                    bVar34 = anchor[-1] == pBStack_158[-1];
                  }
                  if (!bVar34) break;
                  anchor = anchor + -1;
                  pBStack_158 = pBStack_158 + -1;
                  lStack_110 = lStack_110 + 1;
                }
              }
              else {
                sVar28 = ZSTD_count(anchor + 4,pBStack_158 + 4,pBVar25);
                lStack_110 = sVar28 + 4;
                h2._4_4_ = iVar14 - (int)pBStack_158;
                while( true ) {
                  bVar34 = false;
                  if (pBStack_80 < anchor && pBVar24 < pBStack_158) {
                    bVar34 = anchor[-1] == pBStack_158[-1];
                  }
                  if (!bVar34) break;
                  anchor = anchor + -1;
                  pBStack_158 = pBStack_158 + -1;
                  lStack_110 = lStack_110 + 1;
                }
              }
            }
LAB_006a959f:
            local_a8 = offsetSaved;
            offsetSaved = h2._4_4_;
            ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_80,pBStack_80,h2._4_4_ + 2,
                          lStack_110 - 3);
            goto LAB_006a95e3;
          }
        }
        else {
          pBStack_158 = pBVar12 + pUVar11[sVar31];
          matchLong._4_4_ = pUVar11[sVar31] + uVar16;
          if (pBVar27 < pBStack_158) {
            UVar19 = MEM_read32(pBStack_158);
            UVar20 = MEM_read32(anchor);
            if (UVar19 == UVar20) goto LAB_006a90aa;
          }
        }
        anchor = anchor + ((long)anchor - (long)pBStack_80 >> 8) + 1;
      }
      else {
        UVar19 = MEM_read32(local_838);
        UVar20 = MEM_read32(anchor + 1);
        if (UVar19 != UVar20) goto LAB_006a8d49;
        local_848 = pBVar25;
        if (uVar18 < uVar3) {
          local_848 = pBVar13;
        }
        sVar28 = ZSTD_count_2segments(anchor + 5,local_838 + 4,pBVar25,local_848,pBVar24);
        lStack_110 = sVar28 + 4;
        anchor = anchor + 1;
        ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_80,pBStack_80,0,sVar28 + 1);
LAB_006a95e3:
        pBStack_80 = anchor + lStack_110;
        anchor = pBStack_80;
        if (pBStack_80 <= pBVar26) {
          sVar28 = ZSTD_hashPtr(pBVar8 + (ulong)uVar17 + 2,UVar2,4);
          pUVar7[sVar28] = uVar17 + 2;
          sVar28 = ZSTD_hashPtr(pBVar8 + (ulong)uVar17 + 2,UVar1,8);
          pUVar6[sVar28] = uVar17 + 2;
          UVar19 = ((int)pBStack_80 + -2) - iVar15;
          sVar28 = ZSTD_hashPtr(pBStack_80 + -2,UVar2,4);
          pUVar7[sVar28] = UVar19;
          sVar28 = ZSTD_hashPtr(pBStack_80 + -2,UVar1,8);
          pUVar6[sVar28] = UVar19;
          for (; UVar19 = local_a8, pBStack_80 = anchor, anchor <= pBVar26;
              anchor = anchor + sVar28 + 4) {
            UVar20 = (int)anchor - iVar15;
            uVar21 = UVar20 - local_a8;
            if (uVar21 < uVar3) {
              local_8d0 = pBVar12 + ((ulong)uVar21 - (ulong)uVar16);
            }
            else {
              local_8d0 = pBVar8 + uVar21;
            }
            if ((uVar3 - 1) - uVar21 < 3) break;
            UVar22 = MEM_read32(local_8d0);
            UVar23 = MEM_read32(anchor);
            if (UVar22 != UVar23) break;
            local_8e0 = pBVar25;
            if (uVar21 < uVar3) {
              local_8e0 = pBVar13;
            }
            sVar28 = ZSTD_count_2segments(anchor + 4,local_8d0 + 4,pBVar25,local_8e0,pBVar24);
            local_a8 = offsetSaved;
            offsetSaved = UVar19;
            ZSTD_storeSeq(seqStore,0,anchor,0,sVar28 + 1);
            sVar29 = ZSTD_hashPtr(anchor,UVar2,4);
            pUVar7[sVar29] = UVar20;
            sVar29 = ZSTD_hashPtr(anchor,UVar1,8);
            pUVar6[sVar29] = UVar20;
          }
        }
      }
      goto LAB_006a8a0f;
    }
    if (offsetSaved == 0) {
      local_928 = 0;
    }
    else {
      local_928 = offsetSaved;
    }
    *rep = local_928;
    if (local_a8 == 0) {
      local_92c = 0;
    }
    else {
      local_92c = local_a8;
    }
    rep[1] = local_92c;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)pBStack_80);
    break;
  case 5:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar7 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar8 = (ms->window).base;
    uVar3 = (ms->window).dictLimit;
    pBVar24 = pBVar8 + uVar3;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved_1 = *rep;
    local_290 = rep[1];
    pZVar9 = ms->dictMatchState;
    pUVar10 = pZVar9->hashTable;
    pUVar11 = pZVar9->chainTable;
    pBVar12 = (pZVar9->window).base;
    pBVar27 = pBVar12 + (pZVar9->window).dictLimit;
    pBVar13 = (pZVar9->window).nextSrc;
    uVar16 = uVar3 - ((int)pBVar13 - (int)pBVar12);
    UVar4 = (pZVar9->cParams).hashLog;
    UVar5 = (pZVar9->cParams).chainLog;
    anchor_1 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar14 - (int)pBVar24) + (int)pBVar13 == (int)pBVar27));
    pBStack_268 = (BYTE *)src;
LAB_006a9fb0:
    if (anchor_1 < pBVar26) {
      sVar28 = ZSTD_hashPtr(anchor_1,UVar1,8);
      sVar29 = ZSTD_hashPtr(anchor_1,UVar2,5);
      sVar30 = ZSTD_hashPtr(anchor_1,UVar4,8);
      sVar31 = ZSTD_hashPtr(anchor_1,UVar5,5);
      iVar15 = (int)pBVar8;
      iVar14 = (int)anchor_1;
      uVar17 = iVar14 - iVar15;
      uVar21 = pUVar6[sVar28];
      matchLong_1._4_4_ = pUVar7[sVar29];
      match_1 = pBVar8 + uVar21;
      pBStack_340 = pBVar8 + matchLong_1._4_4_;
      uVar18 = (uVar17 + 1) - offsetSaved_1;
      if (uVar18 < uVar3) {
        local_980 = pBVar12 + (uVar18 - uVar16);
      }
      else {
        local_980 = pBVar8 + uVar18;
      }
      pUVar7[sVar29] = uVar17;
      pUVar6[sVar28] = uVar17;
      if ((uVar3 - 1) - uVar18 < 3) {
LAB_006aa36c:
        if (uVar3 < uVar21) {
          UVar32 = MEM_read64(match_1);
          UVar33 = MEM_read64(anchor_1);
          if (UVar32 != UVar33) goto LAB_006aa621;
          sVar28 = ZSTD_count(anchor_1 + 8,match_1 + 8,pBVar25);
          lStack_2f8 = sVar28 + 8;
          h2_1._4_4_ = iVar14 - (int)match_1;
          while( true ) {
            bVar34 = false;
            if (pBStack_268 < anchor_1 && pBVar24 < match_1) {
              bVar34 = anchor_1[-1] == match_1[-1];
            }
            if (!bVar34) break;
            anchor_1 = anchor_1 + -1;
            match_1 = match_1 + -1;
            lStack_2f8 = lStack_2f8 + 1;
          }
          goto LAB_006aac8b;
        }
        uVar21 = pUVar10[sVar30];
        pBStack_368 = pBVar12 + uVar21;
        if (pBVar27 < pBStack_368) {
          UVar32 = MEM_read64(pBStack_368);
          UVar33 = MEM_read64(anchor_1);
          if (UVar32 == UVar33) {
            sVar28 = ZSTD_count_2segments(anchor_1 + 8,pBStack_368 + 8,pBVar25,pBVar13,pBVar24);
            lStack_2f8 = sVar28 + 8;
            h2_1._4_4_ = (uVar17 - uVar21) - uVar16;
            while( true ) {
              bVar34 = false;
              if (pBStack_268 < anchor_1 && pBVar27 < pBStack_368) {
                bVar34 = anchor_1[-1] == pBStack_368[-1];
              }
              if (!bVar34) break;
              anchor_1 = anchor_1 + -1;
              pBStack_368 = pBStack_368 + -1;
              lStack_2f8 = lStack_2f8 + 1;
            }
            goto LAB_006aac8b;
          }
        }
LAB_006aa621:
        if (uVar3 < matchLong_1._4_4_) {
          UVar19 = MEM_read32(pBStack_340);
          UVar20 = MEM_read32(anchor_1);
          if (UVar19 == UVar20) {
LAB_006aa718:
            sVar28 = ZSTD_hashPtr(anchor_1 + 1,UVar1,8);
            sVar29 = ZSTD_hashPtr(anchor_1 + 1,UVar4,8);
            uVar21 = pUVar6[sVar28];
            pBStack_390 = pBVar8 + uVar21;
            pUVar6[sVar28] = uVar17 + 1;
            if (uVar3 < uVar21) {
              UVar32 = MEM_read64(pBStack_390);
              UVar33 = MEM_read64(anchor_1 + 1);
              if (UVar32 != UVar33) goto code_r0x006aaa99;
              sVar28 = ZSTD_count(anchor_1 + 9,pBStack_390 + 8,pBVar25);
              lStack_2f8 = sVar28 + 8;
              anchor_1 = anchor_1 + 1;
              h2_1._4_4_ = (int)anchor_1 - (int)pBStack_390;
              while( true ) {
                bVar34 = false;
                if (pBStack_268 < anchor_1 && pBVar24 < pBStack_390) {
                  bVar34 = anchor_1[-1] == pBStack_390[-1];
                }
                if (!bVar34) break;
                anchor_1 = anchor_1 + -1;
                pBStack_390 = pBStack_390 + -1;
                lStack_2f8 = lStack_2f8 + 1;
              }
            }
            else {
              uVar21 = pUVar10[sVar29];
              _repIndex2_1 = pBVar12 + uVar21;
              if (pBVar27 < _repIndex2_1) {
                UVar32 = MEM_read64(_repIndex2_1);
                UVar33 = MEM_read64(anchor_1 + 1);
                if (UVar32 == UVar33) {
                  sVar28 = ZSTD_count_2segments
                                     (anchor_1 + 9,_repIndex2_1 + 8,pBVar25,pBVar13,pBVar24);
                  lStack_2f8 = sVar28 + 8;
                  anchor_1 = anchor_1 + 1;
                  h2_1._4_4_ = ((uVar17 + 1) - uVar21) - uVar16;
                  while( true ) {
                    bVar34 = false;
                    if (pBStack_268 < anchor_1 && pBVar27 < _repIndex2_1) {
                      bVar34 = anchor_1[-1] == _repIndex2_1[-1];
                    }
                    if (!bVar34) break;
                    anchor_1 = anchor_1 + -1;
                    _repIndex2_1 = _repIndex2_1 + -1;
                    lStack_2f8 = lStack_2f8 + 1;
                  }
                  goto LAB_006aac8b;
                }
              }
code_r0x006aaa99:
              if (matchLong_1._4_4_ < uVar3) {
                sVar28 = ZSTD_count_2segments(anchor_1 + 4,pBStack_340 + 4,pBVar25,pBVar13,pBVar24);
                lStack_2f8 = sVar28 + 4;
                h2_1._4_4_ = uVar17 - matchLong_1._4_4_;
                while( true ) {
                  bVar34 = false;
                  if (pBStack_268 < anchor_1 && pBVar27 < pBStack_340) {
                    bVar34 = anchor_1[-1] == pBStack_340[-1];
                  }
                  if (!bVar34) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_340 = pBStack_340 + -1;
                  lStack_2f8 = lStack_2f8 + 1;
                }
              }
              else {
                sVar28 = ZSTD_count(anchor_1 + 4,pBStack_340 + 4,pBVar25);
                lStack_2f8 = sVar28 + 4;
                h2_1._4_4_ = iVar14 - (int)pBStack_340;
                while( true ) {
                  bVar34 = false;
                  if (pBStack_268 < anchor_1 && pBVar24 < pBStack_340) {
                    bVar34 = anchor_1[-1] == pBStack_340[-1];
                  }
                  if (!bVar34) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_340 = pBStack_340 + -1;
                  lStack_2f8 = lStack_2f8 + 1;
                }
              }
            }
LAB_006aac8b:
            local_290 = offsetSaved_1;
            offsetSaved_1 = h2_1._4_4_;
            ZSTD_storeSeq(seqStore,(long)anchor_1 - (long)pBStack_268,pBStack_268,h2_1._4_4_ + 2,
                          lStack_2f8 - 3);
            goto LAB_006aacdb;
          }
        }
        else {
          pBStack_340 = pBVar12 + pUVar11[sVar31];
          matchLong_1._4_4_ = pUVar11[sVar31] + uVar16;
          if (pBVar27 < pBStack_340) {
            UVar19 = MEM_read32(pBStack_340);
            UVar20 = MEM_read32(anchor_1);
            if (UVar19 == UVar20) goto LAB_006aa718;
          }
        }
        anchor_1 = anchor_1 + ((long)anchor_1 - (long)pBStack_268 >> 8) + 1;
      }
      else {
        UVar19 = MEM_read32(local_980);
        UVar20 = MEM_read32(anchor_1 + 1);
        if (UVar19 != UVar20) goto LAB_006aa36c;
        local_990 = pBVar25;
        if (uVar18 < uVar3) {
          local_990 = pBVar13;
        }
        sVar28 = ZSTD_count_2segments(anchor_1 + 5,local_980 + 4,pBVar25,local_990,pBVar24);
        lStack_2f8 = sVar28 + 4;
        anchor_1 = anchor_1 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_1 - (long)pBStack_268,pBStack_268,0,sVar28 + 1);
LAB_006aacdb:
        pBStack_268 = anchor_1 + lStack_2f8;
        anchor_1 = pBStack_268;
        if (pBStack_268 <= pBVar26) {
          sVar28 = ZSTD_hashPtr(pBVar8 + (ulong)uVar17 + 2,UVar2,5);
          pUVar7[sVar28] = uVar17 + 2;
          sVar28 = ZSTD_hashPtr(pBVar8 + (ulong)uVar17 + 2,UVar1,8);
          pUVar6[sVar28] = uVar17 + 2;
          UVar19 = ((int)pBStack_268 + -2) - iVar15;
          sVar28 = ZSTD_hashPtr(pBStack_268 + -2,UVar2,5);
          pUVar7[sVar28] = UVar19;
          sVar28 = ZSTD_hashPtr(pBStack_268 + -2,UVar1,8);
          pUVar6[sVar28] = UVar19;
          for (; UVar19 = local_290, pBStack_268 = anchor_1, anchor_1 <= pBVar26;
              anchor_1 = anchor_1 + sVar28 + 4) {
            UVar20 = (int)anchor_1 - iVar15;
            uVar21 = UVar20 - local_290;
            if (uVar21 < uVar3) {
              local_a18 = pBVar12 + ((ulong)uVar21 - (ulong)uVar16);
            }
            else {
              local_a18 = pBVar8 + uVar21;
            }
            if ((uVar3 - 1) - uVar21 < 3) break;
            UVar22 = MEM_read32(local_a18);
            UVar23 = MEM_read32(anchor_1);
            if (UVar22 != UVar23) break;
            local_a28 = pBVar25;
            if (uVar21 < uVar3) {
              local_a28 = pBVar13;
            }
            sVar28 = ZSTD_count_2segments(anchor_1 + 4,local_a18 + 4,pBVar25,local_a28,pBVar24);
            local_290 = offsetSaved_1;
            offsetSaved_1 = UVar19;
            ZSTD_storeSeq(seqStore,0,anchor_1,0,sVar28 + 1);
            sVar29 = ZSTD_hashPtr(anchor_1,UVar2,5);
            pUVar7[sVar29] = UVar20;
            sVar29 = ZSTD_hashPtr(anchor_1,UVar1,8);
            pUVar6[sVar29] = UVar20;
          }
        }
      }
      goto LAB_006a9fb0;
    }
    if (offsetSaved_1 == 0) {
      local_a70 = 0;
    }
    else {
      local_a70 = offsetSaved_1;
    }
    *rep = local_a70;
    if (local_290 == 0) {
      local_a74 = 0;
    }
    else {
      local_a74 = local_290;
    }
    rep[1] = local_a74;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)pBStack_268);
    break;
  case 6:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar7 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar8 = (ms->window).base;
    uVar3 = (ms->window).dictLimit;
    pBVar24 = pBVar8 + uVar3;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved_2 = *rep;
    local_478 = rep[1];
    pZVar9 = ms->dictMatchState;
    pUVar10 = pZVar9->hashTable;
    pUVar11 = pZVar9->chainTable;
    pBVar12 = (pZVar9->window).base;
    pBVar27 = pBVar12 + (pZVar9->window).dictLimit;
    pBVar13 = (pZVar9->window).nextSrc;
    uVar16 = uVar3 - ((int)pBVar13 - (int)pBVar12);
    UVar4 = (pZVar9->cParams).hashLog;
    UVar5 = (pZVar9->cParams).chainLog;
    anchor_2 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar14 - (int)pBVar24) + (int)pBVar13 == (int)pBVar27));
    pBStack_450 = (BYTE *)src;
LAB_006ab77d:
    if (anchor_2 < pBVar26) {
      sVar28 = ZSTD_hashPtr(anchor_2,UVar1,8);
      sVar29 = ZSTD_hashPtr(anchor_2,UVar2,6);
      sVar30 = ZSTD_hashPtr(anchor_2,UVar4,8);
      sVar31 = ZSTD_hashPtr(anchor_2,UVar5,6);
      iVar15 = (int)pBVar8;
      iVar14 = (int)anchor_2;
      uVar17 = iVar14 - iVar15;
      uVar21 = pUVar6[sVar28];
      matchLong_2._4_4_ = pUVar7[sVar29];
      match_2 = pBVar8 + uVar21;
      pBStack_528 = pBVar8 + matchLong_2._4_4_;
      uVar18 = (uVar17 + 1) - offsetSaved_2;
      if (uVar18 < uVar3) {
        local_ac8 = pBVar12 + (uVar18 - uVar16);
      }
      else {
        local_ac8 = pBVar8 + uVar18;
      }
      pUVar7[sVar29] = uVar17;
      pUVar6[sVar28] = uVar17;
      if ((uVar3 - 1) - uVar18 < 3) {
LAB_006abb39:
        if (uVar3 < uVar21) {
          UVar32 = MEM_read64(match_2);
          UVar33 = MEM_read64(anchor_2);
          if (UVar32 != UVar33) goto LAB_006abdee;
          sVar28 = ZSTD_count(anchor_2 + 8,match_2 + 8,pBVar25);
          lStack_4e0 = sVar28 + 8;
          h2_2._4_4_ = iVar14 - (int)match_2;
          while( true ) {
            bVar34 = false;
            if (pBStack_450 < anchor_2 && pBVar24 < match_2) {
              bVar34 = anchor_2[-1] == match_2[-1];
            }
            if (!bVar34) break;
            anchor_2 = anchor_2 + -1;
            match_2 = match_2 + -1;
            lStack_4e0 = lStack_4e0 + 1;
          }
          goto LAB_006ac458;
        }
        uVar21 = pUVar10[sVar30];
        pBStack_550 = pBVar12 + uVar21;
        if (pBVar27 < pBStack_550) {
          UVar32 = MEM_read64(pBStack_550);
          UVar33 = MEM_read64(anchor_2);
          if (UVar32 == UVar33) {
            sVar28 = ZSTD_count_2segments(anchor_2 + 8,pBStack_550 + 8,pBVar25,pBVar13,pBVar24);
            lStack_4e0 = sVar28 + 8;
            h2_2._4_4_ = (uVar17 - uVar21) - uVar16;
            while( true ) {
              bVar34 = false;
              if (pBStack_450 < anchor_2 && pBVar27 < pBStack_550) {
                bVar34 = anchor_2[-1] == pBStack_550[-1];
              }
              if (!bVar34) break;
              anchor_2 = anchor_2 + -1;
              pBStack_550 = pBStack_550 + -1;
              lStack_4e0 = lStack_4e0 + 1;
            }
            goto LAB_006ac458;
          }
        }
LAB_006abdee:
        if (uVar3 < matchLong_2._4_4_) {
          UVar19 = MEM_read32(pBStack_528);
          UVar20 = MEM_read32(anchor_2);
          if (UVar19 == UVar20) {
LAB_006abee5:
            sVar28 = ZSTD_hashPtr(anchor_2 + 1,UVar1,8);
            sVar29 = ZSTD_hashPtr(anchor_2 + 1,UVar4,8);
            uVar21 = pUVar6[sVar28];
            pBStack_578 = pBVar8 + uVar21;
            pUVar6[sVar28] = uVar17 + 1;
            if (uVar3 < uVar21) {
              UVar32 = MEM_read64(pBStack_578);
              UVar33 = MEM_read64(anchor_2 + 1);
              if (UVar32 != UVar33) goto code_r0x006ac266;
              sVar28 = ZSTD_count(anchor_2 + 9,pBStack_578 + 8,pBVar25);
              lStack_4e0 = sVar28 + 8;
              anchor_2 = anchor_2 + 1;
              h2_2._4_4_ = (int)anchor_2 - (int)pBStack_578;
              while( true ) {
                bVar34 = false;
                if (pBStack_450 < anchor_2 && pBVar24 < pBStack_578) {
                  bVar34 = anchor_2[-1] == pBStack_578[-1];
                }
                if (!bVar34) break;
                anchor_2 = anchor_2 + -1;
                pBStack_578 = pBStack_578 + -1;
                lStack_4e0 = lStack_4e0 + 1;
              }
            }
            else {
              uVar21 = pUVar10[sVar29];
              _repIndex2_2 = pBVar12 + uVar21;
              if (pBVar27 < _repIndex2_2) {
                UVar32 = MEM_read64(_repIndex2_2);
                UVar33 = MEM_read64(anchor_2 + 1);
                if (UVar32 == UVar33) {
                  sVar28 = ZSTD_count_2segments
                                     (anchor_2 + 9,_repIndex2_2 + 8,pBVar25,pBVar13,pBVar24);
                  lStack_4e0 = sVar28 + 8;
                  anchor_2 = anchor_2 + 1;
                  h2_2._4_4_ = ((uVar17 + 1) - uVar21) - uVar16;
                  while( true ) {
                    bVar34 = false;
                    if (pBStack_450 < anchor_2 && pBVar27 < _repIndex2_2) {
                      bVar34 = anchor_2[-1] == _repIndex2_2[-1];
                    }
                    if (!bVar34) break;
                    anchor_2 = anchor_2 + -1;
                    _repIndex2_2 = _repIndex2_2 + -1;
                    lStack_4e0 = lStack_4e0 + 1;
                  }
                  goto LAB_006ac458;
                }
              }
code_r0x006ac266:
              if (matchLong_2._4_4_ < uVar3) {
                sVar28 = ZSTD_count_2segments(anchor_2 + 4,pBStack_528 + 4,pBVar25,pBVar13,pBVar24);
                lStack_4e0 = sVar28 + 4;
                h2_2._4_4_ = uVar17 - matchLong_2._4_4_;
                while( true ) {
                  bVar34 = false;
                  if (pBStack_450 < anchor_2 && pBVar27 < pBStack_528) {
                    bVar34 = anchor_2[-1] == pBStack_528[-1];
                  }
                  if (!bVar34) break;
                  anchor_2 = anchor_2 + -1;
                  pBStack_528 = pBStack_528 + -1;
                  lStack_4e0 = lStack_4e0 + 1;
                }
              }
              else {
                sVar28 = ZSTD_count(anchor_2 + 4,pBStack_528 + 4,pBVar25);
                lStack_4e0 = sVar28 + 4;
                h2_2._4_4_ = iVar14 - (int)pBStack_528;
                while( true ) {
                  bVar34 = false;
                  if (pBStack_450 < anchor_2 && pBVar24 < pBStack_528) {
                    bVar34 = anchor_2[-1] == pBStack_528[-1];
                  }
                  if (!bVar34) break;
                  anchor_2 = anchor_2 + -1;
                  pBStack_528 = pBStack_528 + -1;
                  lStack_4e0 = lStack_4e0 + 1;
                }
              }
            }
LAB_006ac458:
            local_478 = offsetSaved_2;
            offsetSaved_2 = h2_2._4_4_;
            ZSTD_storeSeq(seqStore,(long)anchor_2 - (long)pBStack_450,pBStack_450,h2_2._4_4_ + 2,
                          lStack_4e0 - 3);
            goto LAB_006ac4a8;
          }
        }
        else {
          pBStack_528 = pBVar12 + pUVar11[sVar31];
          matchLong_2._4_4_ = pUVar11[sVar31] + uVar16;
          if (pBVar27 < pBStack_528) {
            UVar19 = MEM_read32(pBStack_528);
            UVar20 = MEM_read32(anchor_2);
            if (UVar19 == UVar20) goto LAB_006abee5;
          }
        }
        anchor_2 = anchor_2 + ((long)anchor_2 - (long)pBStack_450 >> 8) + 1;
      }
      else {
        UVar19 = MEM_read32(local_ac8);
        UVar20 = MEM_read32(anchor_2 + 1);
        if (UVar19 != UVar20) goto LAB_006abb39;
        local_ad8 = pBVar25;
        if (uVar18 < uVar3) {
          local_ad8 = pBVar13;
        }
        sVar28 = ZSTD_count_2segments(anchor_2 + 5,local_ac8 + 4,pBVar25,local_ad8,pBVar24);
        lStack_4e0 = sVar28 + 4;
        anchor_2 = anchor_2 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_2 - (long)pBStack_450,pBStack_450,0,sVar28 + 1);
LAB_006ac4a8:
        pBStack_450 = anchor_2 + lStack_4e0;
        anchor_2 = pBStack_450;
        if (pBStack_450 <= pBVar26) {
          sVar28 = ZSTD_hashPtr(pBVar8 + (ulong)uVar17 + 2,UVar2,6);
          pUVar7[sVar28] = uVar17 + 2;
          sVar28 = ZSTD_hashPtr(pBVar8 + (ulong)uVar17 + 2,UVar1,8);
          pUVar6[sVar28] = uVar17 + 2;
          UVar19 = ((int)pBStack_450 + -2) - iVar15;
          sVar28 = ZSTD_hashPtr(pBStack_450 + -2,UVar2,6);
          pUVar7[sVar28] = UVar19;
          sVar28 = ZSTD_hashPtr(pBStack_450 + -2,UVar1,8);
          pUVar6[sVar28] = UVar19;
          for (; UVar19 = local_478, pBStack_450 = anchor_2, anchor_2 <= pBVar26;
              anchor_2 = anchor_2 + sVar28 + 4) {
            UVar20 = (int)anchor_2 - iVar15;
            uVar21 = UVar20 - local_478;
            if (uVar21 < uVar3) {
              local_b60 = pBVar12 + ((ulong)uVar21 - (ulong)uVar16);
            }
            else {
              local_b60 = pBVar8 + uVar21;
            }
            if ((uVar3 - 1) - uVar21 < 3) break;
            UVar22 = MEM_read32(local_b60);
            UVar23 = MEM_read32(anchor_2);
            if (UVar22 != UVar23) break;
            local_b70 = pBVar25;
            if (uVar21 < uVar3) {
              local_b70 = pBVar13;
            }
            sVar28 = ZSTD_count_2segments(anchor_2 + 4,local_b60 + 4,pBVar25,local_b70,pBVar24);
            local_478 = offsetSaved_2;
            offsetSaved_2 = UVar19;
            ZSTD_storeSeq(seqStore,0,anchor_2,0,sVar28 + 1);
            sVar29 = ZSTD_hashPtr(anchor_2,UVar2,6);
            pUVar7[sVar29] = UVar20;
            sVar29 = ZSTD_hashPtr(anchor_2,UVar1,8);
            pUVar6[sVar29] = UVar20;
          }
        }
      }
      goto LAB_006ab77d;
    }
    if (offsetSaved_2 == 0) {
      local_bb8 = 0;
    }
    else {
      local_bb8 = offsetSaved_2;
    }
    *rep = local_bb8;
    if (local_478 == 0) {
      local_bbc = 0;
    }
    else {
      local_bbc = local_478;
    }
    rep[1] = local_bbc;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)pBStack_450);
    break;
  case 7:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar7 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar8 = (ms->window).base;
    uVar3 = (ms->window).dictLimit;
    pBVar24 = pBVar8 + uVar3;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved_3 = *rep;
    local_660 = rep[1];
    pZVar9 = ms->dictMatchState;
    pUVar10 = pZVar9->hashTable;
    pUVar11 = pZVar9->chainTable;
    pBVar12 = (pZVar9->window).base;
    pBVar27 = pBVar12 + (pZVar9->window).dictLimit;
    pBVar13 = (pZVar9->window).nextSrc;
    uVar16 = uVar3 - ((int)pBVar13 - (int)pBVar12);
    UVar4 = (pZVar9->cParams).hashLog;
    UVar5 = (pZVar9->cParams).chainLog;
    anchor_3 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar14 - (int)pBVar24) + (int)pBVar13 == (int)pBVar27));
    pBStack_638 = (BYTE *)src;
LAB_006acf4a:
    if (anchor_3 < pBVar26) {
      sVar28 = ZSTD_hashPtr(anchor_3,UVar1,8);
      sVar29 = ZSTD_hashPtr(anchor_3,UVar2,7);
      sVar30 = ZSTD_hashPtr(anchor_3,UVar4,8);
      sVar31 = ZSTD_hashPtr(anchor_3,UVar5,7);
      iVar15 = (int)pBVar8;
      iVar14 = (int)anchor_3;
      uVar17 = iVar14 - iVar15;
      uVar21 = pUVar6[sVar28];
      matchLong_3._4_4_ = pUVar7[sVar29];
      match_3 = pBVar8 + uVar21;
      pBStack_710 = pBVar8 + matchLong_3._4_4_;
      uVar18 = (uVar17 + 1) - offsetSaved_3;
      if (uVar18 < uVar3) {
        local_c10 = pBVar12 + (uVar18 - uVar16);
      }
      else {
        local_c10 = pBVar8 + uVar18;
      }
      pUVar7[sVar29] = uVar17;
      pUVar6[sVar28] = uVar17;
      if ((uVar3 - 1) - uVar18 < 3) {
LAB_006ad306:
        if (uVar3 < uVar21) {
          UVar32 = MEM_read64(match_3);
          UVar33 = MEM_read64(anchor_3);
          if (UVar32 != UVar33) goto LAB_006ad5bb;
          sVar28 = ZSTD_count(anchor_3 + 8,match_3 + 8,pBVar25);
          lStack_6c8 = sVar28 + 8;
          h2_3._4_4_ = iVar14 - (int)match_3;
          while( true ) {
            bVar34 = false;
            if (pBStack_638 < anchor_3 && pBVar24 < match_3) {
              bVar34 = anchor_3[-1] == match_3[-1];
            }
            if (!bVar34) break;
            anchor_3 = anchor_3 + -1;
            match_3 = match_3 + -1;
            lStack_6c8 = lStack_6c8 + 1;
          }
          goto LAB_006adc25;
        }
        uVar21 = pUVar10[sVar30];
        pBStack_738 = pBVar12 + uVar21;
        if (pBVar27 < pBStack_738) {
          UVar32 = MEM_read64(pBStack_738);
          UVar33 = MEM_read64(anchor_3);
          if (UVar32 == UVar33) {
            sVar28 = ZSTD_count_2segments(anchor_3 + 8,pBStack_738 + 8,pBVar25,pBVar13,pBVar24);
            lStack_6c8 = sVar28 + 8;
            h2_3._4_4_ = (uVar17 - uVar21) - uVar16;
            while( true ) {
              bVar34 = false;
              if (pBStack_638 < anchor_3 && pBVar27 < pBStack_738) {
                bVar34 = anchor_3[-1] == pBStack_738[-1];
              }
              if (!bVar34) break;
              anchor_3 = anchor_3 + -1;
              pBStack_738 = pBStack_738 + -1;
              lStack_6c8 = lStack_6c8 + 1;
            }
            goto LAB_006adc25;
          }
        }
LAB_006ad5bb:
        if (uVar3 < matchLong_3._4_4_) {
          UVar19 = MEM_read32(pBStack_710);
          UVar20 = MEM_read32(anchor_3);
          if (UVar19 == UVar20) {
LAB_006ad6b2:
            sVar28 = ZSTD_hashPtr(anchor_3 + 1,UVar1,8);
            sVar29 = ZSTD_hashPtr(anchor_3 + 1,UVar4,8);
            uVar21 = pUVar6[sVar28];
            pBStack_760 = pBVar8 + uVar21;
            pUVar6[sVar28] = uVar17 + 1;
            if (uVar3 < uVar21) {
              UVar32 = MEM_read64(pBStack_760);
              UVar33 = MEM_read64(anchor_3 + 1);
              if (UVar32 != UVar33) goto code_r0x006ada33;
              sVar28 = ZSTD_count(anchor_3 + 9,pBStack_760 + 8,pBVar25);
              lStack_6c8 = sVar28 + 8;
              anchor_3 = anchor_3 + 1;
              h2_3._4_4_ = (int)anchor_3 - (int)pBStack_760;
              while( true ) {
                bVar34 = false;
                if (pBStack_638 < anchor_3 && pBVar24 < pBStack_760) {
                  bVar34 = anchor_3[-1] == pBStack_760[-1];
                }
                if (!bVar34) break;
                anchor_3 = anchor_3 + -1;
                pBStack_760 = pBStack_760 + -1;
                lStack_6c8 = lStack_6c8 + 1;
              }
            }
            else {
              uVar21 = pUVar10[sVar29];
              _repIndex2_3 = pBVar12 + uVar21;
              if (pBVar27 < _repIndex2_3) {
                UVar32 = MEM_read64(_repIndex2_3);
                UVar33 = MEM_read64(anchor_3 + 1);
                if (UVar32 == UVar33) {
                  sVar28 = ZSTD_count_2segments
                                     (anchor_3 + 9,_repIndex2_3 + 8,pBVar25,pBVar13,pBVar24);
                  lStack_6c8 = sVar28 + 8;
                  anchor_3 = anchor_3 + 1;
                  h2_3._4_4_ = ((uVar17 + 1) - uVar21) - uVar16;
                  while( true ) {
                    bVar34 = false;
                    if (pBStack_638 < anchor_3 && pBVar27 < _repIndex2_3) {
                      bVar34 = anchor_3[-1] == _repIndex2_3[-1];
                    }
                    if (!bVar34) break;
                    anchor_3 = anchor_3 + -1;
                    _repIndex2_3 = _repIndex2_3 + -1;
                    lStack_6c8 = lStack_6c8 + 1;
                  }
                  goto LAB_006adc25;
                }
              }
code_r0x006ada33:
              if (matchLong_3._4_4_ < uVar3) {
                sVar28 = ZSTD_count_2segments(anchor_3 + 4,pBStack_710 + 4,pBVar25,pBVar13,pBVar24);
                lStack_6c8 = sVar28 + 4;
                h2_3._4_4_ = uVar17 - matchLong_3._4_4_;
                while( true ) {
                  bVar34 = false;
                  if (pBStack_638 < anchor_3 && pBVar27 < pBStack_710) {
                    bVar34 = anchor_3[-1] == pBStack_710[-1];
                  }
                  if (!bVar34) break;
                  anchor_3 = anchor_3 + -1;
                  pBStack_710 = pBStack_710 + -1;
                  lStack_6c8 = lStack_6c8 + 1;
                }
              }
              else {
                sVar28 = ZSTD_count(anchor_3 + 4,pBStack_710 + 4,pBVar25);
                lStack_6c8 = sVar28 + 4;
                h2_3._4_4_ = iVar14 - (int)pBStack_710;
                while( true ) {
                  bVar34 = false;
                  if (pBStack_638 < anchor_3 && pBVar24 < pBStack_710) {
                    bVar34 = anchor_3[-1] == pBStack_710[-1];
                  }
                  if (!bVar34) break;
                  anchor_3 = anchor_3 + -1;
                  pBStack_710 = pBStack_710 + -1;
                  lStack_6c8 = lStack_6c8 + 1;
                }
              }
            }
LAB_006adc25:
            local_660 = offsetSaved_3;
            offsetSaved_3 = h2_3._4_4_;
            ZSTD_storeSeq(seqStore,(long)anchor_3 - (long)pBStack_638,pBStack_638,h2_3._4_4_ + 2,
                          lStack_6c8 - 3);
            goto LAB_006adc75;
          }
        }
        else {
          pBStack_710 = pBVar12 + pUVar11[sVar31];
          matchLong_3._4_4_ = pUVar11[sVar31] + uVar16;
          if (pBVar27 < pBStack_710) {
            UVar19 = MEM_read32(pBStack_710);
            UVar20 = MEM_read32(anchor_3);
            if (UVar19 == UVar20) goto LAB_006ad6b2;
          }
        }
        anchor_3 = anchor_3 + ((long)anchor_3 - (long)pBStack_638 >> 8) + 1;
      }
      else {
        UVar19 = MEM_read32(local_c10);
        UVar20 = MEM_read32(anchor_3 + 1);
        if (UVar19 != UVar20) goto LAB_006ad306;
        local_c20 = pBVar25;
        if (uVar18 < uVar3) {
          local_c20 = pBVar13;
        }
        sVar28 = ZSTD_count_2segments(anchor_3 + 5,local_c10 + 4,pBVar25,local_c20,pBVar24);
        lStack_6c8 = sVar28 + 4;
        anchor_3 = anchor_3 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_3 - (long)pBStack_638,pBStack_638,0,sVar28 + 1);
LAB_006adc75:
        pBStack_638 = anchor_3 + lStack_6c8;
        anchor_3 = pBStack_638;
        if (pBStack_638 <= pBVar26) {
          sVar28 = ZSTD_hashPtr(pBVar8 + (ulong)uVar17 + 2,UVar2,7);
          pUVar7[sVar28] = uVar17 + 2;
          sVar28 = ZSTD_hashPtr(pBVar8 + (ulong)uVar17 + 2,UVar1,8);
          pUVar6[sVar28] = uVar17 + 2;
          UVar19 = ((int)pBStack_638 + -2) - iVar15;
          sVar28 = ZSTD_hashPtr(pBStack_638 + -2,UVar2,7);
          pUVar7[sVar28] = UVar19;
          sVar28 = ZSTD_hashPtr(pBStack_638 + -2,UVar1,8);
          pUVar6[sVar28] = UVar19;
          for (; UVar19 = local_660, pBStack_638 = anchor_3, anchor_3 <= pBVar26;
              anchor_3 = anchor_3 + sVar28 + 4) {
            UVar20 = (int)anchor_3 - iVar15;
            uVar21 = UVar20 - local_660;
            if (uVar21 < uVar3) {
              local_ca8 = pBVar12 + ((ulong)uVar21 - (ulong)uVar16);
            }
            else {
              local_ca8 = pBVar8 + uVar21;
            }
            if ((uVar3 - 1) - uVar21 < 3) break;
            UVar22 = MEM_read32(local_ca8);
            UVar23 = MEM_read32(anchor_3);
            if (UVar22 != UVar23) break;
            local_cb8 = pBVar25;
            if (uVar21 < uVar3) {
              local_cb8 = pBVar13;
            }
            sVar28 = ZSTD_count_2segments(anchor_3 + 4,local_ca8 + 4,pBVar25,local_cb8,pBVar24);
            local_660 = offsetSaved_3;
            offsetSaved_3 = UVar19;
            ZSTD_storeSeq(seqStore,0,anchor_3,0,sVar28 + 1);
            sVar29 = ZSTD_hashPtr(anchor_3,UVar2,7);
            pUVar7[sVar29] = UVar20;
            sVar29 = ZSTD_hashPtr(anchor_3,UVar1,8);
            pUVar6[sVar29] = UVar20;
          }
        }
      }
      goto LAB_006acf4a;
    }
    if (offsetSaved_3 == 0) {
      local_d00 = 0;
    }
    else {
      local_d00 = offsetSaved_3;
    }
    *rep = local_d00;
    if (local_660 == 0) {
      local_d04 = 0;
    }
    else {
      local_d04 = local_660;
    }
    rep[1] = local_d04;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)pBStack_638);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}